

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O0

int z_inflateReset(z_streamp strm)

{
  internal_state *piVar1;
  ct_data_s *pcVar2;
  inflate_state *state;
  z_streamp strm_local;
  
  if ((strm == (z_streamp)0x0) || (strm->state == (internal_state *)0x0)) {
    strm_local._4_4_ = -2;
  }
  else {
    piVar1 = strm->state;
    *(undefined4 *)&piVar1->field_0x1c = 0;
    strm->total_out = 0;
    strm->total_in = 0;
    strm->msg = (char *)0x0;
    strm->adler = 1;
    *(undefined4 *)&piVar1->strm = 0;
    *(undefined4 *)((long)&piVar1->strm + 4) = 0;
    *(undefined4 *)&piVar1->field_0xc = 0;
    *(undefined4 *)((long)&piVar1->pending_buf + 4) = 0x8000;
    piVar1->pending_out = (z_Bytef *)0x0;
    piVar1->wrap = 0;
    *(undefined4 *)&piVar1->gzhead = 0;
    *(undefined4 *)((long)&piVar1->gzhead + 4) = 0;
    piVar1->last_flush = 0;
    piVar1->w_size = 0;
    pcVar2 = piVar1->dyn_ltree + 0x123;
    *(ct_data_s **)&piVar1->hash_shift = pcVar2;
    piVar1->prev = (Posf *)pcVar2;
    *(ct_data_s **)&piVar1->window_size = pcVar2;
    strm_local._4_4_ = 0;
  }
  return strm_local._4_4_;
}

Assistant:

int ZEXPORT inflateReset(strm)
z_streamp strm;
{
    struct inflate_state FAR *state;

    if (strm == Z_NULL || strm->state == Z_NULL) return Z_STREAM_ERROR;
    state = (struct inflate_state FAR *)strm->state;
    strm->total_in = strm->total_out = state->total = 0;
    strm->msg = Z_NULL;
    strm->adler = 1;        /* to support ill-conceived Java test suite */
    state->mode = HEAD;
    state->last = 0;
    state->havedict = 0;
    state->dmax = 32768U;
    state->head = Z_NULL;
    state->wsize = 0;
    state->whave = 0;
    state->write = 0;
    state->hold = 0;
    state->bits = 0;
    state->lencode = state->distcode = state->next = state->codes;
    Tracev((stderr, "inflate: reset\n"));
    return Z_OK;
}